

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Strash(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint Limit;
  int iVar4;
  Gia_Man_t *pGVar5;
  Gia_Man_t *pGVar6;
  char *pcVar7;
  char *pcVar8;
  uint local_44;
  uint local_40;
  
  local_40 = 0;
  Extra_UtilGetoptReset();
  Limit = 2;
  bVar2 = false;
  local_44 = 0;
  bVar1 = false;
  do {
    while( true ) {
      while (iVar3 = Extra_UtilGetopt(argc,argv,"Lacmrh"), iVar4 = globalUtilOptind, iVar3 == 0x72)
      {
        bVar1 = (bool)(bVar1 ^ 1);
      }
      if (iVar3 < 0x61) break;
      if (iVar3 == 0x61) {
        local_40 = local_40 ^ 1;
      }
      else if (iVar3 == 99) {
        bVar2 = (bool)(bVar2 ^ 1);
      }
      else {
        if (iVar3 != 0x6d) goto LAB_00228920;
        local_44 = local_44 ^ 1;
      }
    }
    if (iVar3 == -1) {
      pGVar5 = pAbc->pGia;
      if (pGVar5 != (Gia_Man_t *)0x0) {
        if ((pGVar5->vMapping == (Vec_Int_t *)0x0) || (!bVar1)) {
          if (pGVar5->vMapping != (Vec_Int_t *)0x0) {
            if (pGVar5->vConfigs == (Vec_Int_t *)0x0) {
              pGVar5 = (Gia_Man_t *)Dsm_ManDeriveGia(pGVar5,local_44);
            }
            else {
              pGVar5 = (Gia_Man_t *)If_ManDeriveGiaFromCells(pGVar5);
            }
            goto LAB_002287e9;
          }
          if (local_44 != 0) {
            if (pGVar5->pMuxes != (uint *)0x0) {
              pcVar7 = "Abc_CommandAbc9Strash(): The AIG already has MUXes.\n";
              goto LAB_0022879f;
            }
            pGVar5 = Gia_ManDupMuxes(pGVar5,Limit);
            pcVar7 = Abc_FrameReadFlag("silentmode");
            if (pcVar7 == (char *)0x0) {
              pcVar7 = "Generated AND/XOR/MUX graph.";
LAB_00228a74:
              puts(pcVar7);
            }
            goto LAB_002287e9;
          }
          if ((!bVar2) || (pGVar5->pAigExtra == (Gia_Man_t *)0x0)) {
            if (pGVar5->pMuxes == (uint *)0x0) {
              pGVar5 = Gia_ManRehash(pGVar5,local_40);
            }
            else {
              pGVar5 = Gia_ManDupNoMuxes(pGVar5);
              pcVar7 = Abc_FrameReadFlag("silentmode");
              if (pcVar7 == (char *)0x0) {
                pcVar7 = "Generated AIG from AND/XOR/MUX graph.";
                goto LAB_00228a74;
              }
            }
            goto LAB_002287e9;
          }
          if (pGVar5->nBufs != 0) {
            __assert_fail("!Gia_ManBufNum(pAbc->pGia)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abc.c"
                          ,0x6d69,"int Abc_CommandAbc9Strash(Abc_Frame_t *, int, char **)");
          }
          iVar4 = Gia_ManIsSeqWithBoxes(pGVar5);
          if ((iVar4 == 0) && (iVar4 = Gia_ManRegBoxNum(pAbc->pGia), iVar4 == 0)) {
            pGVar5 = Gia_ManDupCollapse(pAbc->pGia,pAbc->pGia->pAigExtra,(Vec_Int_t *)0x0,0);
          }
          else {
            pGVar6 = Gia_ManDupUnshuffleInputs(pAbc->pGia);
            Gia_ManTransferTiming(pGVar6,pAbc->pGia);
            pGVar5 = pGVar6->pAigExtra;
            iVar4 = Gia_ManRegBoxNum(pGVar6);
            pGVar5 = Gia_ManDupCollapse(pGVar6,pGVar5,(Vec_Int_t *)0x0,(uint)(0 < iVar4));
            Gia_ManTransferTiming(pAbc->pGia,pGVar6);
            Gia_ManStop(pGVar6);
          }
          pcVar7 = Abc_FrameReadFlag("silentmode");
          if (pcVar7 == (char *)0x0) {
            puts("Collapsed AIG with boxes and logic of the boxes.");
          }
LAB_002287ed:
          pGVar6 = pAbc->pGia;
          if (pGVar6->pAigExtra != (Gia_Man_t *)0x0) goto LAB_00228833;
        }
        else {
          pGVar5 = Gia_ManDupHashMapping(pGVar5);
          Gia_ManTransferPacking(pGVar5,pAbc->pGia);
          Gia_ManTransferTiming(pGVar5,pAbc->pGia);
LAB_002287e9:
          if (bVar2) goto LAB_002287ed;
          pGVar6 = pAbc->pGia;
        }
        Gia_ManTransferTiming(pGVar5,pGVar6);
        pGVar6 = pAbc->pGia;
        pcVar7 = pGVar5->pCellStr;
        pGVar6->vConfigs = pGVar5->vConfigs;
        pGVar6->pCellStr = pcVar7;
        pGVar5->vConfigs = (Vec_Int_t *)0x0;
        pGVar5->pCellStr = (char *)0x0;
LAB_00228833:
        Abc_FrameUpdateGia(pAbc,pGVar5);
        return 0;
      }
      pcVar7 = "Abc_CommandAbc9Strash(): There is no AIG.\n";
LAB_0022879f:
      iVar4 = -1;
      goto LAB_00228a00;
    }
    if (iVar3 != 0x4c) goto LAB_00228920;
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
      goto LAB_00228920;
    }
    Limit = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar4 + 1;
    if ((int)Limit < 0) {
LAB_00228920:
      Abc_Print(-2,"usage: &st [-L num] [-acmrh]\n");
      Abc_Print(-2,"\t         performs structural hashing\n");
      pcVar8 = "yes";
      pcVar7 = "yes";
      if (local_40 == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-a     : toggle additional hashing [default = %s]\n",pcVar7);
      pcVar7 = "yes";
      if (!bVar2) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-c     : toggle collapsing hierarchical AIG [default = %s]\n",pcVar7);
      pcVar7 = "yes";
      if (local_44 == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-m     : toggle converting to larger gates [default = %s]\n",pcVar7);
      Abc_Print(-2,
                "\t-L num : create MUX when sum of refs does not exceed this limit [default = %d]\n"
                ,(ulong)Limit);
      Abc_Print(-2,"\t         (use L = 1 to create AIG with XORs but without MUXes)\n");
      if (!bVar1) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-r     : toggle rehashing AIG while preserving mapping [default = %s]\n",
                pcVar8);
      pcVar7 = "\t-h     : print the command usage\n";
      iVar4 = -2;
LAB_00228a00:
      Abc_Print(iVar4,pcVar7);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Strash( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    int c, Limit = 2;
    int fAddStrash = 0;
    int fCollapse = 0;
    int fAddMuxes = 0;
    int fRehashMap = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Lacmrh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            Limit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Limit < 0 )
                goto usage;
            break;
        case 'a':
            fAddStrash ^= 1;
            break;
        case 'c':
            fCollapse ^= 1;
            break;
        case 'm':
            fAddMuxes ^= 1;
            break;
        case 'r':
            fRehashMap ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Strash(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManHasMapping(pAbc->pGia) && fRehashMap )
    {
        pTemp = Gia_ManDupHashMapping( pAbc->pGia );
        Gia_ManTransferPacking( pTemp, pAbc->pGia );
        Gia_ManTransferTiming( pTemp, pAbc->pGia );
    }
    else if ( Gia_ManHasMapping(pAbc->pGia) && pAbc->pGia->vConfigs )
        pTemp = (Gia_Man_t *)If_ManDeriveGiaFromCells( pAbc->pGia );
    else if ( Gia_ManHasMapping(pAbc->pGia) )
        pTemp = (Gia_Man_t *)Dsm_ManDeriveGia( pAbc->pGia, fAddMuxes ); // delay-oriented unmapping
    else if ( fAddMuxes )
    {
        if ( pAbc->pGia->pMuxes )
        {
            Abc_Print( -1, "Abc_CommandAbc9Strash(): The AIG already has MUXes.\n" );
            return 1;
        }
        pTemp = Gia_ManDupMuxes( pAbc->pGia, Limit );
        if ( !Abc_FrameReadFlag("silentmode") )
            printf( "Generated AND/XOR/MUX graph.\n" );
    }
    else if ( fCollapse && pAbc->pGia->pAigExtra )
    {
        assert( !Gia_ManBufNum(pAbc->pGia) );
        if ( Gia_ManIsSeqWithBoxes(pAbc->pGia) || Gia_ManRegBoxNum(pAbc->pGia) )
        {
            Gia_Man_t * pUnshuffled = Gia_ManDupUnshuffleInputs( pAbc->pGia );
            Gia_ManTransferTiming( pUnshuffled, pAbc->pGia );
            pTemp = Gia_ManDupCollapse( pUnshuffled, pUnshuffled->pAigExtra, NULL, Gia_ManRegBoxNum(pUnshuffled) > 0 );
            Gia_ManTransferTiming( pAbc->pGia, pUnshuffled );
            Gia_ManStop( pUnshuffled );
        }
        else
            pTemp = Gia_ManDupCollapse( pAbc->pGia, pAbc->pGia->pAigExtra, NULL, 0 );
        if ( !Abc_FrameReadFlag("silentmode") )
            printf( "Collapsed AIG with boxes and logic of the boxes.\n" );
    }
    else if ( pAbc->pGia->pMuxes )
    {
        pTemp = Gia_ManDupNoMuxes( pAbc->pGia );
        if ( !Abc_FrameReadFlag("silentmode") )
            printf( "Generated AIG from AND/XOR/MUX graph.\n" );
    }
    else
    {
        pTemp = Gia_ManRehash( pAbc->pGia, fAddStrash );
//        if ( !Abc_FrameReadFlag("silentmode") )
//            printf( "Rehashed the current AIG.\n" );
    }
    if ( !(fCollapse && pAbc->pGia->pAigExtra) )
    {
        Gia_ManTransferTiming( pTemp, pAbc->pGia );
        pAbc->pGia->vConfigs = pTemp->vConfigs;     pTemp->vConfigs = NULL;
        pAbc->pGia->pCellStr = pTemp->pCellStr;     pTemp->pCellStr = NULL;
    }
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &st [-L num] [-acmrh]\n" );
    Abc_Print( -2, "\t         performs structural hashing\n" );
    Abc_Print( -2, "\t-a     : toggle additional hashing [default = %s]\n", fAddStrash? "yes": "no" );
    Abc_Print( -2, "\t-c     : toggle collapsing hierarchical AIG [default = %s]\n", fCollapse? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle converting to larger gates [default = %s]\n", fAddMuxes? "yes": "no" );
    Abc_Print( -2, "\t-L num : create MUX when sum of refs does not exceed this limit [default = %d]\n", Limit );
    Abc_Print( -2, "\t         (use L = 1 to create AIG with XORs but without MUXes)\n" );
    Abc_Print( -2, "\t-r     : toggle rehashing AIG while preserving mapping [default = %s]\n", fRehashMap? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}